

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::RemoveProperty(Element *this,String *name)

{
  PropertyId id;
  ShorthandId id_00;
  PropertyIdSetIterator PVar1;
  PropertyIdSetIterator it;
  PropertyIdSet property_id_set;
  PropertyIdSetIterator local_38;
  PropertyIdSet local_28;
  
  id = StyleSheetSpecification::GetPropertyId(name);
  if (id != Invalid) {
    ElementStyle::RemoveProperty(&this->meta->style,id);
    return;
  }
  id_00 = StyleSheetSpecification::GetShorthandId(name);
  if (id_00 != Invalid) {
    local_28 = StyleSheetSpecification::GetShorthandUnderlyingProperties(id_00);
    local_38 = PropertyIdSet::begin(&local_28);
    while( true ) {
      PVar1 = PropertyIdSet::end(&local_28);
      if (PVar1 == local_38) break;
      ElementStyle::RemoveProperty(&this->meta->style,(PropertyId)local_38.id_index);
      PropertyIdSetIterator::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void Element::RemoveProperty(const String& name)
{
	auto property_id = StyleSheetSpecification::GetPropertyId(name);
	if (property_id != PropertyId::Invalid)
		meta->style.RemoveProperty(property_id);
	else
	{
		auto shorthand_id = StyleSheetSpecification::GetShorthandId(name);
		if (shorthand_id != ShorthandId::Invalid)
		{
			auto property_id_set = StyleSheetSpecification::GetShorthandUnderlyingProperties(shorthand_id);
			for (auto it = property_id_set.begin(); it != property_id_set.end(); ++it)
				meta->style.RemoveProperty(*it);
		}
	}
}